

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TitleSpecsOf.hpp
# Opt level: O1

void __thiscall
sciplot::TitleSpecsOf<sciplot::LegendSpecs>::TitleSpecsOf
          (TitleSpecsOf<sciplot::LegendSpecs> *this,void **vtt)

{
  void *pvVar1;
  string local_50;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  (this->m_title)._M_dataplus._M_p = (pointer)&(this->m_title).field_2;
  (this->m_title)._M_string_length = 0;
  (this->m_title).field_2._M_local_buf[0] = '\0';
  *(undefined ***)
   &(this->m_text_specs).super_TextSpecsOf<sciplot::TextSpecs>.super_FontSpecsOf<sciplot::TextSpecs>
       = &PTR__Specs_001a8bc0;
  TextSpecsOf<sciplot::TextSpecs>::TextSpecsOf
            (&(this->m_text_specs).super_TextSpecsOf<sciplot::TextSpecs>,&PTR_PTR_001a79f8);
  *(undefined ***)
   &(this->m_text_specs).super_TextSpecsOf<sciplot::TextSpecs>.super_FontSpecsOf<sciplot::TextSpecs>
       = &PTR__TextSpecs_001a79d8;
  *(undefined ***)&(this->m_offset_specs).super_OffsetSpecsOf<sciplot::OffsetSpecs> =
       &PTR__Specs_001a8be8;
  OffsetSpecsOf<sciplot::OffsetSpecs>::OffsetSpecsOf
            (&(this->m_offset_specs).super_OffsetSpecsOf<sciplot::OffsetSpecs>,&PTR_PTR_001a78c8);
  *(undefined ***)&(this->m_offset_specs).super_OffsetSpecsOf<sciplot::OffsetSpecs> =
       &PTR__OffsetSpecs_001a78a8;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  title(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TitleSpecsOf<DerivedSpecs>::TitleSpecsOf()
{
    title("");
}